

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall gl4cts::EnhancedLayouts::XFBInputTest::testInit(XFBInputTest *this)

{
  GLuint qualifier;
  QUALIFIERS QVar1;
  GLuint stage;
  STAGES SVar2;
  testCase test_case;
  value_type local_28;
  
  QVar1 = BUFFER;
LAB_00968385:
  if (QVar1 == QUALIFIERS_MAX) {
    return;
  }
  SVar2 = COMPUTE;
  do {
    if (SVar2 != COMPUTE) {
      if (SVar2 == STAGE_MAX) break;
      local_28.m_stage = SVar2;
      local_28.m_qualifier = QVar1;
      std::
      vector<gl4cts::EnhancedLayouts::XFBInputTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInputTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_28);
    }
    SVar2 = SVar2 + VERTEX;
  } while( true );
  QVar1 = QVar1 + STRIDE;
  goto LAB_00968385;
}

Assistant:

void XFBInputTest::testInit()
{
	for (GLuint qualifier = 0; qualifier < QUALIFIERS_MAX; ++qualifier)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (Utils::Shader::COMPUTE == stage)
			{
				continue;
			}

			testCase test_case = { (QUALIFIERS)qualifier, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}